

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

bool __thiscall Polymer::CheckPolCollisions(Polymer *this,int pol_index)

{
  long *plVar1;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppVar3;
  size_type *psVar4;
  int iVar5;
  bool bVar6;
  Ptr next_pol;
  Ptr this_pol;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar5 = (int)this + 0x90;
  MobileElementManager::GetPol((MobileElementManager *)local_2c0,iVar5);
  if ((ulong)(long)(pol_index + 1) <
      (ulong)((long)(this->polymerases_).polymerases_.
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->polymerases_).polymerases_.
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    MobileElementManager::GetPol((MobileElementManager *)local_2f0,iVar5);
    iVar5 = *(int *)((long)&(((pointer)(local_2c0._0_8_ + 0x20))->second).
                            super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 4);
    if ((iVar5 < *(int *)(local_2f0._0_8_ + 0x38)) ||
       (*(int *)(local_2f0._0_8_ + 0x3c) <
        *(int *)&(((pointer)(local_2c0._0_8_ + 0x20))->second).
                 super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
      if (3 < iVar5 - *(int *)(local_2f0._0_8_ + 0x38)) {
        std::operator+(&local_150,"Polymerase ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(((shared_ptr<Polymer> *)(local_2c0._0_8_ + 0x10))->
                        super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_2b0._M_dataplus._M_p = (pointer)*plVar1;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p == paVar2) {
          local_2b0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = plVar1[3];
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        }
        else {
          local_2b0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
        }
        local_2b0._M_string_length = plVar1[1];
        *plVar1 = (long)paVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::to_string
                  (&local_170,
                   *(int *)&(((pointer)(local_2c0._0_8_ + 0x20))->second).
                            super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi);
        std::operator+(&local_130,&local_2b0,&local_170);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_290._0_8_ = *plVar1;
        ppVar3 = (pointer)(plVar1 + 2);
        if ((pointer)local_290._0_8_ == ppVar3) {
          local_290._16_8_ =
               (ppVar3->first).super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_290._24_8_ = plVar1[3];
          local_290._0_8_ = (pointer)(local_290 + 0x10);
        }
        else {
          local_290._16_8_ =
               (ppVar3->first).super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        local_290._8_8_ = plVar1[1];
        *plVar1 = (long)ppVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::to_string
                  (&local_190,
                   *(int *)((long)&(((pointer)(local_2c0._0_8_ + 0x20))->second).
                                   super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi + 4));
        std::operator+(&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_290,&local_190);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_270._M_allocated_capacity = *plVar1;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_allocated_capacity == paVar2) {
          local_260._M_allocated_capacity = paVar2->_M_allocated_capacity;
          local_260._8_8_ = plVar1[3];
          local_270._M_allocated_capacity = (size_type)&local_260;
        }
        else {
          local_260._M_allocated_capacity = paVar2->_M_allocated_capacity;
        }
        local_270._8_8_ = plVar1[1];
        *plVar1 = (long)paVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::to_string(&local_1b0,pol_index);
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_270,&local_1b0);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_2e0._M_dataplus._M_p = (pointer)*plVar1;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p == paVar2) {
          local_2e0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
          local_2e0.field_2._8_8_ = plVar1[3];
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
        }
        local_2e0._M_string_length = plVar1[1];
        *plVar1 = (long)paVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::operator+(&local_d0,&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_2f0._0_8_ + 0x18));
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_330._M_dataplus._M_p = (pointer)*plVar1;
        psVar4 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_330._M_dataplus._M_p == psVar4) {
          local_330.field_2._M_allocated_capacity = *psVar4;
          local_330.field_2._8_8_ = plVar1[3];
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        }
        else {
          local_330.field_2._M_allocated_capacity = *psVar4;
        }
        local_330._M_string_length = plVar1[1];
        *plVar1 = (long)psVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::to_string(&local_1d0,*(int *)(local_2f0._0_8_ + 0x38));
        std::operator+(&local_b0,&local_330,&local_1d0);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_310._M_dataplus._M_p = (pointer)*plVar1;
        psVar4 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_310._M_dataplus._M_p == psVar4) {
          local_310.field_2._M_allocated_capacity = *psVar4;
          local_310.field_2._8_8_ = plVar1[3];
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        }
        else {
          local_310.field_2._M_allocated_capacity = *psVar4;
        }
        local_310._M_string_length = plVar1[1];
        *plVar1 = (long)psVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::to_string(&local_1f0,*(int *)(local_2f0._0_8_ + 0x3c));
        std::operator+(&local_90,&local_310,&local_1f0);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_250._M_dataplus._M_p = (pointer)*plVar1;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p == paVar2) {
          local_250.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
          local_250.field_2._8_8_ = plVar1[3];
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        }
        else {
          local_250.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
        }
        local_250._M_string_length = plVar1[1];
        *plVar1 = (long)paVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::to_string(&local_210,pol_index + 1);
        std::operator+(&local_70,&local_250,&local_210);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_230._M_dataplus._M_p = (pointer)*plVar1;
        psVar4 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_230._M_dataplus._M_p == psVar4) {
          local_230.field_2._M_allocated_capacity = *psVar4;
          local_230.field_2._8_8_ = plVar1[3];
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar4;
        }
        local_230._M_string_length = plVar1[1];
        *plVar1 = (long)psVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::operator+(&local_50,&local_230,&this->name_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_allocated_capacity != &local_260) {
          operator_delete((void *)local_270._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((pointer)local_290._0_8_ != (pointer)(local_290 + 0x10)) {
          operator_delete((void *)local_290._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,(string *)&local_50);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_);
    }
  }
  else {
    bVar6 = false;
  }
  if ((pointer)local_2c0._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0._8_8_);
  }
  return bVar6;
}

Assistant:

bool Polymer::CheckPolCollisions(int pol_index) {
  auto this_pol = polymerases_.GetPol(pol_index);
  if (!polymerases_.ValidIndex(pol_index + 1)) {
    // Are there any polymerases ahead of this one?
    return false;
  }
  auto next_pol = polymerases_.GetPol(pol_index + 1);
  // We only need to check the polymerase one position ahead of this
  // polymerase
  if ((this_pol->stop() >= next_pol->start()) &&
      (next_pol->stop() >= this_pol->start())) {
    // Error checking. TODO: Can this be removed?
    if (this_pol->stop() - next_pol->start() > 3) {
      std::string err = "Polymerase " + this_pol->name() +
                        " (start: " + std::to_string(this_pol->start()) +
                        ", stop: " + std::to_string(this_pol->stop()) +
                        ", index: " + std::to_string(pol_index) +
                        ") is overlapping polymerase " + next_pol->name() +
                        " (start: " + std::to_string(next_pol->start()) +
                        ", stop: " + std::to_string(next_pol->stop()) +
                        ", index: " + std::to_string(pol_index + 1) +
                        ") by more than one position on polymer " + name_;
      throw std::runtime_error(err);
    }
    return true;
  }
  return false;
}